

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O1

void vkt::tessellation::anon_unknown_2::initProgramsFillCoverCase
               (SourceCollections *programCollection,CaseDefinition *caseDef)

{
  TessPrimitiveType TVar1;
  SpacingMode SVar2;
  pointer pcVar3;
  bool bVar4;
  char *pcVar5;
  size_t sVar6;
  ProgramSources *pPVar7;
  char *__s;
  ostringstream src;
  long *local_228;
  long local_220;
  long local_218 [2];
  string local_208;
  uint local_1e8;
  value_type local_1e0;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long local_198 [14];
  ios_base local_128 [264];
  
  local_1c0._0_4_ = caseDef->primitiveType;
  local_1c0._4_4_ = caseDef->spacingMode;
  pcVar3 = (caseDef->referenceImagePathPrefix)._M_dataplus._M_p;
  local_1b8._M_p = (pointer)&local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar3,
             pcVar3 + (caseDef->referenceImagePathPrefix)._M_string_length);
  initCommonPrograms(programCollection,(CaseDefinition *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar5 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)&local_228 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x90);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"#extension GL_EXT_tessellation_shader : require\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"layout(",7);
  TVar1 = caseDef->primitiveType;
  if (TVar1 == TESSPRIMITIVETYPE_TRIANGLES) {
    pcVar5 = "triangles";
LAB_007a34e7:
    bVar4 = false;
  }
  else {
    if (TVar1 == TESSPRIMITIVETYPE_ISOLINES) {
      pcVar5 = "isolines";
      goto LAB_007a34e7;
    }
    if (TVar1 == TESSPRIMITIVETYPE_QUADS) {
      pcVar5 = "quads";
      goto LAB_007a34e7;
    }
    bVar4 = true;
    pcVar5 = (char *)0x0;
  }
  if (bVar4) {
    std::ios::clear((int)&local_228 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x90);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,", ",2);
  SVar2 = caseDef->spacingMode;
  if (SVar2 == SPACINGMODE_EQUAL) {
    pcVar5 = "equal_spacing";
  }
  else if (SVar2 == SPACINGMODE_FRACTIONAL_EVEN) {
    pcVar5 = "fractional_even_spacing";
  }
  else {
    if (SVar2 != SPACINGMODE_FRACTIONAL_ODD) {
      bVar4 = true;
      pcVar5 = (char *)0x0;
      goto LAB_007a3580;
    }
    pcVar5 = "fractional_odd_spacing";
  }
  bVar4 = false;
LAB_007a3580:
  if (bVar4) {
    std::ios::clear((int)&local_228 + (int)*(undefined8 *)(local_198[0] + -0x18) + 0x90);
  }
  else {
    sVar6 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar5,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(location = 0) in  highp vec2 in_te_position[];\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(location = 0) out highp vec4 in_f_color;\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"{\n",2);
  pcVar5 = "";
  if (caseDef->primitiveType == TESSPRIMITIVETYPE_QUADS) {
    pcVar5 = 
    "    highp vec2 corner0 = in_te_position[0];\n    highp vec2 corner1 = in_te_position[1];\n    highp vec2 corner2 = in_te_position[2];\n    highp vec2 corner3 = in_te_position[3];\n    highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n                   + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n                   + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n                   + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n    highp float d = 2.0 * min(abs(gl_TessCoord.x-0.5), abs(gl_TessCoord.y-0.5));\n    highp vec2 fromCenter = pos - (corner0 + corner1 + corner2 + corner3) / 4.0;\n    highp float f = (1.0 - length(fromCenter)) * sqrt(1.7 - d);\n    pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n    gl_Position = vec4(pos, 0.0, 1.0);\n"
    ;
  }
  __s = 
  "    highp float d = 3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z));\n    highp vec2 corner0 = in_te_position[0];\n    highp vec2 corner1 = in_te_position[1];\n    highp vec2 corner2 = in_te_position[2];\n    highp vec2 pos =  corner0*gl_TessCoord.x + corner1*gl_TessCoord.y + corner2*gl_TessCoord.z;\n    highp vec2 fromCenter = pos - (corner0 + corner1 + corner2) / 3.0;\n    highp float f = (1.0 - length(fromCenter)) * (1.5 - d);\n    pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n    gl_Position = vec4(pos, 0.0, 1.0);\n"
  ;
  if (caseDef->primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    __s = pcVar5;
  }
  sVar6 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"    in_f_color = vec4(1.0);\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}\n",2);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"tese","");
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_208);
  std::__cxx11::stringbuf::str();
  local_1e8 = 4;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_228,local_220 + (long)local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar7->sources + local_1e8,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void initProgramsFillCoverCase (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	DE_ASSERT(caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES || caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS);

	initCommonPrograms(programCollection, caseDef);

	// Tessellation evaluation shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(" << getTessPrimitiveTypeShaderName(caseDef.primitiveType) << ", "
						 << getSpacingModeShaderName(caseDef.spacingMode) << ") in;\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec2 in_te_position[];\n"
			<< "layout(location = 0) out highp vec4 in_f_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<<	(caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
					"    highp float d = 3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z));\n"
					"    highp vec2 corner0 = in_te_position[0];\n"
					"    highp vec2 corner1 = in_te_position[1];\n"
					"    highp vec2 corner2 = in_te_position[2];\n"
					"    highp vec2 pos =  corner0*gl_TessCoord.x + corner1*gl_TessCoord.y + corner2*gl_TessCoord.z;\n"
					"    highp vec2 fromCenter = pos - (corner0 + corner1 + corner2) / 3.0;\n"
					"    highp float f = (1.0 - length(fromCenter)) * (1.5 - d);\n"
					"    pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n"
					"    gl_Position = vec4(pos, 0.0, 1.0);\n"
				: caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS ?
					"    highp vec2 corner0 = in_te_position[0];\n"
					"    highp vec2 corner1 = in_te_position[1];\n"
					"    highp vec2 corner2 = in_te_position[2];\n"
					"    highp vec2 corner3 = in_te_position[3];\n"
					"    highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner0\n"
					"                   + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*corner1\n"
					"                   + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*corner2\n"
					"                   + (    gl_TessCoord.x)*(    gl_TessCoord.y)*corner3;\n"
					"    highp float d = 2.0 * min(abs(gl_TessCoord.x-0.5), abs(gl_TessCoord.y-0.5));\n"
					"    highp vec2 fromCenter = pos - (corner0 + corner1 + corner2 + corner3) / 4.0;\n"
					"    highp float f = (1.0 - length(fromCenter)) * sqrt(1.7 - d);\n"
					"    pos += 0.75 * f * fromCenter / (length(fromCenter) + 0.3);\n"
					"    gl_Position = vec4(pos, 0.0, 1.0);\n"
				: "")
			<< "    in_f_color = vec4(1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}
}